

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextGLImpl.cpp
# Opt level: O2

void __thiscall
Diligent::DeviceContextGLImpl::BuildTLAS(DeviceContextGLImpl *this,BuildTLASAttribs *Attribs)

{
  string msg;
  string local_28;
  
  FormatString<char[37]>(&local_28,(char (*) [37])"BuildTLAS is not supported in OpenGL");
  DebugAssertionFailed
            (local_28._M_dataplus._M_p,"BuildTLAS",
             "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/DeviceContextGLImpl.cpp"
             ,0x7ea);
  std::__cxx11::string::~string((string *)&local_28);
  return;
}

Assistant:

void DeviceContextGLImpl::BuildTLAS(const BuildTLASAttribs& Attribs)
{
    UNSUPPORTED("BuildTLAS is not supported in OpenGL");
}